

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_smooth_poly1.cpp
# Opt level: O0

void __thiscall
agg::vcgen_smooth_poly1::calculate
          (vcgen_smooth_poly1 *this,vertex_dist *v0,vertex_dist *v1,vertex_dist *v2,vertex_dist *v3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double ym2;
  double xm2;
  double ym1;
  double xm1;
  double k2;
  double k1;
  vertex_dist *v3_local;
  vertex_dist *v2_local;
  vertex_dist *v1_local;
  vertex_dist *v0_local;
  vcgen_smooth_poly1 *this_local;
  
  dVar10 = v0->dist / (v0->dist + v1->dist);
  dVar11 = v1->dist / (v1->dist + v2->dist);
  dVar1 = v0->y;
  dVar2 = v2->y;
  dVar3 = v0->y;
  dVar4 = v1->x;
  dVar5 = v3->x;
  dVar6 = v1->x;
  dVar7 = v1->y;
  dVar8 = v3->y;
  dVar9 = v1->y;
  this->m_ctrl1_x = this->m_smooth_value * (v2->x - ((v2->x - v0->x) * dVar10 + v0->x)) + v1->x;
  this->m_ctrl1_y = this->m_smooth_value * (v2->y - ((dVar2 - dVar3) * dVar10 + dVar1)) + v1->y;
  this->m_ctrl2_x = this->m_smooth_value * (v1->x - ((dVar5 - dVar6) * dVar11 + dVar4)) + v2->x;
  this->m_ctrl2_y = this->m_smooth_value * (v1->y - ((dVar8 - dVar9) * dVar11 + dVar7)) + v2->y;
  return;
}

Assistant:

void vcgen_smooth_poly1::calculate(const vertex_dist& v0, 
                                       const vertex_dist& v1, 
                                       const vertex_dist& v2,
                                       const vertex_dist& v3)
    {

        double k1 = v0.dist / (v0.dist + v1.dist);
        double k2 = v1.dist / (v1.dist + v2.dist);

        double xm1 = v0.x + (v2.x - v0.x) * k1;
        double ym1 = v0.y + (v2.y - v0.y) * k1;
        double xm2 = v1.x + (v3.x - v1.x) * k2;
        double ym2 = v1.y + (v3.y - v1.y) * k2;

        m_ctrl1_x = v1.x + m_smooth_value * (v2.x - xm1);
        m_ctrl1_y = v1.y + m_smooth_value * (v2.y - ym1);
        m_ctrl2_x = v2.x + m_smooth_value * (v1.x - xm2);
        m_ctrl2_y = v2.y + m_smooth_value * (v1.y - ym2);
    }